

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O2

void bsPutBit(BitStream *bs,Int32 bit)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  uint uVar3;
  BitStream *bs_00;
  
  if (bs->buffLive == 8) {
    uVar3 = bs->buffer & 0xff;
    bs_00 = (BitStream *)(ulong)uVar3;
    __stream = (FILE *)bs->handle;
    iVar1 = putc(uVar3,__stream);
    uVar3 = (uint)__stream;
    if (iVar1 == -1) {
      writeError();
      for (uVar2 = 7; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
        bsPutBit(bs_00,(uint)((uVar3 >> (uVar2 & 0x1f) & 1) != 0));
      }
      return;
    }
    bytesOut = bytesOut + 1;
    bs->buffLive = 1;
    bs->buffer = bit & 1;
  }
  else {
    bs->buffer = (bit & 1U) + bs->buffer * 2;
    bs->buffLive = bs->buffLive + 1;
  }
  return;
}

Assistant:

static void bsPutBit ( BitStream* bs, Int32 bit )
{
   if (bs->buffLive == 8) {
      Int32 retVal = putc ( (UChar) bs->buffer, bs->handle );
      if (retVal == EOF) writeError();
      bytesOut++;
      bs->buffLive = 1;
      bs->buffer = bit & 0x1;
   } else {
      bs->buffer = ( (bs->buffer << 1) | (bit & 0x1) );
      bs->buffLive++;
   };
}